

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::convert_buffer_latin1
               (char_t **out_buffer,size_t *out_length,void *contents,size_t size,bool is_mutable)

{
  size_t __n;
  long lVar1;
  value_type vVar2;
  void *__dest;
  value_type puVar3;
  size_t in_RCX;
  uint8_t *in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  uint8_t *oend;
  uint8_t *obegin;
  char_t *buffer;
  size_t length;
  size_t postfix_length;
  uint8_t *postfix;
  size_t prefix_length;
  size_t data_length;
  uint8_t *data;
  undefined1 in_stack_ffffffffffffff7f;
  size_t in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  size_t *in_stack_ffffffffffffff90;
  char_t **in_stack_ffffffffffffff98;
  bool local_1;
  
  __n = get_latin1_7bit_prefix_length(in_RDX,in_RCX);
  lVar1 = in_RCX - __n;
  if (lVar1 == 0) {
    local_1 = get_mutable_buffer(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                 (bool)in_stack_ffffffffffffff7f);
  }
  else {
    vVar2 = latin1_decoder::process<pugi::impl::(anonymous_namespace)::utf8_counter>
                      (in_RDX + __n,lVar1,0);
    __dest = (void *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                               allocate)(__n + vVar2 + 1);
    if (__dest == (void *)0x0) {
      local_1 = false;
    }
    else {
      memcpy(__dest,in_RDX,__n);
      puVar3 = latin1_decoder::process<pugi::impl::(anonymous_namespace)::utf8_writer>
                         (in_RDX + __n,lVar1,(long)__dest + __n);
      *puVar3 = '\0';
      *in_RDI = __dest;
      *in_RSI = __n + vVar2 + 1;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

PUGI__FN bool convert_buffer_latin1(char_t*& out_buffer, size_t& out_length, const void* contents, size_t size, bool is_mutable)
	{
		const uint8_t* data = static_cast<const uint8_t*>(contents);
		size_t data_length = size;

		// get size of prefix that does not need utf8 conversion
		size_t prefix_length = get_latin1_7bit_prefix_length(data, data_length);
		assert(prefix_length <= data_length);

		const uint8_t* postfix = data + prefix_length;
		size_t postfix_length = data_length - prefix_length;

		// if no conversion is needed, just return the original buffer
		if (postfix_length == 0) return get_mutable_buffer(out_buffer, out_length, contents, size, is_mutable);

		// first pass: get length in utf8 units
		size_t length = prefix_length + latin1_decoder::process(postfix, postfix_length, 0, utf8_counter());

		// allocate buffer of suitable length
		char_t* buffer = static_cast<char_t*>(xml_memory::allocate((length + 1) * sizeof(char_t)));
		if (!buffer) return false;

		// second pass: convert latin1 input to utf8
		memcpy(buffer, data, prefix_length);

		uint8_t* obegin = reinterpret_cast<uint8_t*>(buffer);
		uint8_t* oend = latin1_decoder::process(postfix, postfix_length, obegin + prefix_length, utf8_writer());

		assert(oend == obegin + length);
		*oend = 0;

		out_buffer = buffer;
		out_length = length + 1;

		return true;
	}